

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuilderClearCode
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    PrintNestedBuilderCondition
              (this,printer,"$name$_ = null;\n","$name$_ = null;\n$name$Builder_ = null;\n");
    return;
  }
  PrintNestedBuilderCondition(this,printer,"$name$_ = null;\n","$name$Builder_.clear();\n");
  io::Printer::Print(printer,&this->variables_,"$clear_has_field_bit_builder$\n");
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::
GenerateBuilderClearCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    PrintNestedBuilderCondition(printer,
      "$name$_ = null;\n",

      "$name$Builder_.clear();\n");
    printer->Print(variables_, "$clear_has_field_bit_builder$\n");
  } else {
    PrintNestedBuilderCondition(printer,
      "$name$_ = null;\n",

      "$name$_ = null;\n"
      "$name$Builder_ = null;\n");
  }
}